

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.cpp
# Opt level: O2

string * __thiscall
duckdb::Hugeint::ToString_abi_cxx11_(string *__return_storage_ptr__,Hugeint *this,hugeint_t input)

{
  uint64_t *in_R8;
  hugeint_t lhs;
  hugeint_t local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  uint64_t local_a0;
  uint64_t remainder;
  string result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_b8.upper = input.lower;
  local_b8.lower = (uint64_t)this;
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  if (local_b8.upper == 0x8000000000000000 && this == (Hugeint *)0x0) {
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"-170141183460469231731687303715884105728",
               (allocator *)&local_50);
  }
  else {
    local_a0 = local_b8.upper;
    if (local_b8.upper < 0) {
      NegateInPlace<true>(&local_b8);
    }
    local_a8 = __return_storage_ptr__;
    while( true ) {
      __return_storage_ptr__ = local_a8;
      if ((Hugeint *)local_b8.lower == (Hugeint *)0x0 && local_b8.upper == 0) break;
      lhs.upper = 10;
      lhs.lower = local_b8.upper;
      local_b8 = DivModPositive((Hugeint *)local_b8.lower,lhs,(uint64_t)&remainder,in_R8);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&local_70,'\x01');
      ::std::operator+(&local_50,&local_70,&result);
      ::std::__cxx11::string::operator=((string *)&result,(string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_70);
    }
    if (result._M_string_length == 0) {
      ::std::__cxx11::string::string((string *)local_a8,"0",(allocator *)&local_50);
    }
    else if ((long)local_a0 < 0) {
      ::std::operator+(local_a8,"-",&result);
    }
    else {
      ::std::__cxx11::string::string((string *)local_a8,(string *)&result);
    }
  }
  ::std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

string Hugeint::ToString(hugeint_t input) {
	uint64_t remainder;
	string result;
	if (input == NumericLimits<hugeint_t>::Minimum()) {
		return string(Hugeint::HUGEINT_MINIMUM_STRING);
	}
	bool negative = input.upper < 0;
	if (negative) {
		NegateInPlace(input);
	}
	while (true) {
		if (!input.lower && !input.upper) {
			break;
		}
		input = Hugeint::DivModPositive(input, 10, remainder);
		result = string(1, UnsafeNumericCast<char>('0' + remainder)) + result; // NOLINT
	}
	if (result.empty()) {
		// value is zero
		return "0";
	}
	return negative ? "-" + result : result;
}